

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void print_footer(OSQPInfo *info,c_int polish)

{
  long in_RSI;
  ulong *in_RDI;
  
  printf("\n");
  printf("status:               %s\n",in_RDI + 1);
  if ((in_RSI != 0) && (in_RDI[5] == 1)) {
    if (in_RDI[6] == 1) {
      printf("solution polish:      successful\n");
    }
    else if ((long)in_RDI[6] < 0) {
      printf("solution polish:      unsuccessful\n");
    }
  }
  printf("number of iterations: %i\n",*in_RDI & 0xffffffff);
  if ((in_RDI[5] == 1) || (in_RDI[5] == 2)) {
    printf("optimal objective:    %.4f\n",in_RDI[7]);
  }
  printf("run time:             %.2es\n",in_RDI[0xe]);
  printf("optimal rho estimate: %.2e\n",in_RDI[0x10]);
  printf("\n");
  return;
}

Assistant:

void print_footer(OSQPInfo *info, c_int polish) {
  c_print("\n"); // Add space after iterations

  c_print("status:               %s\n", info->status);

  if (polish && (info->status_val == OSQP_SOLVED)) {
    if (info->status_polish == 1) {
      c_print("solution polish:      successful\n");
    } else if (info->status_polish < 0) {
      c_print("solution polish:      unsuccessful\n");
    }
  }

  c_print("number of iterations: %i\n", (int)info->iter);

  if ((info->status_val == OSQP_SOLVED) ||
      (info->status_val == OSQP_SOLVED_INACCURATE)) {
    c_print("optimal objective:    %.4f\n", info->obj_val);
  }

# ifdef PROFILING
  c_print("run time:             %.2es\n", info->run_time);
# endif /* ifdef PROFILING */

# if EMBEDDED != 1
  c_print("optimal rho estimate: %.2e\n", info->rho_estimate);
# endif /* if EMBEDDED != 1 */
  c_print("\n");
}